

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmExecutionStatus *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  mode_t *permissions_local;
  string *arg_local;
  cmFileCopier *this_local;
  
  bVar1 = cmFSPermissions::stringToModeT(arg,permissions);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,this->Name);
    poVar2 = std::operator<<(poVar2," given invalid permission \"");
    poVar2 = std::operator<<(poVar2,(string *)arg);
    std::operator<<(poVar2,"\".");
    this_00 = this->Status;
    std::__cxx11::ostringstream::str();
    cmExecutionStatus::SetError(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return bVar1;
}

Assistant:

bool cmFileCopier::CheckPermissions(std::string const& arg,
                                    mode_t& permissions)
{
  if (!cmFSPermissions::stringToModeT(arg, permissions)) {
    std::ostringstream e;
    e << this->Name << " given invalid permission \"" << arg << "\".";
    this->Status.SetError(e.str());
    return false;
  }
  return true;
}